

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator+(uchar lhs,SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  undefined3 in_register_00000039;
  
  SVar1.m_int = (ulong)CONCAT31(in_register_00000039,lhs) + rhs.m_int;
  if (rhs.m_int <= SVar1.m_int) {
    return (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)SVar1.m_int;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is std::int64_t, rhs unsigned < 64-bit
        // Some compilers get optimization-happy, let's thwart them

        std::uint64_t tmp = (std::uint64_t)lhs + (std::uint64_t)rhs;

        if( (std::int64_t)tmp >= lhs )
        {
            result = (T)(std::int64_t)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }